

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsAttributeLocationTests.cpp
# Opt level: O1

IterateResult __thiscall deqp::gls::BindRelinkAttributeTest::iterate(BindRelinkAttributeTest *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  void *pvVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  Cond local_190;
  string local_168;
  Attribute local_148;
  vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  preLinkBindings;
  vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
  attributes;
  AttribType vec4;
  vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  postLinkBindings;
  vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  noBindings;
  
  noBindings.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  noBindings.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  noBindings.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  paVar1 = &local_148.m_type.m_name.field_2;
  local_148.m_type.m_name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"vec4","");
  vec4.m_name._M_dataplus._M_p = (pointer)&vec4.m_name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&vec4,local_148.m_type.m_name._M_dataplus._M_p,
             local_148.m_type.m_name._M_dataplus._M_p + local_148.m_type.m_name._M_string_length);
  vec4.m_locationSize = 1;
  vec4.m_glTypeEnum = 0x8b52;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148.m_type.m_name._M_dataplus._M_p != paVar1) {
    operator_delete(local_148.m_type.m_name._M_dataplus._M_p,
                    local_148.m_type.m_name.field_2._M_allocated_capacity + 1);
  }
  attributes.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  attributes.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  attributes.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  preLinkBindings.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  preLinkBindings.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  preLinkBindings.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  postLinkBindings.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  postLinkBindings.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  postLinkBindings.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  paVar2 = &local_168.field_2;
  local_168._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"a_0","");
  paVar6 = &local_190.m_name.field_2;
  local_190.m_negate = true;
  local_190.m_name.field_2._M_allocated_capacity = 0x737961776c615f5f;
  local_190.m_name.field_2._8_2_ = 0x5f5f;
  local_190.m_name._M_string_length = 10;
  local_190.m_name.field_2._M_local_buf[10] = '\0';
  local_190.m_name._M_dataplus._M_p = (pointer)paVar6;
  AttributeLocationTestUtil::Attribute::Attribute(&local_148,&vec4,&local_168,-1,&local_190,-1);
  std::
  vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
  ::emplace_back<deqp::gls::AttributeLocationTestUtil::Attribute>(&attributes,&local_148);
  paVar3 = &local_148.m_cond.m_name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148.m_cond.m_name._M_dataplus._M_p != paVar3) {
    operator_delete(local_148.m_cond.m_name._M_dataplus._M_p,
                    local_148.m_cond.m_name.field_2._M_allocated_capacity + 1);
  }
  paVar4 = &local_148.m_name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148.m_name._M_dataplus._M_p != paVar4) {
    operator_delete(local_148.m_name._M_dataplus._M_p,
                    local_148.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148.m_type.m_name._M_dataplus._M_p != paVar1) {
    operator_delete(local_148.m_type.m_name._M_dataplus._M_p,
                    local_148.m_type.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190.m_name._M_dataplus._M_p != paVar6) {
    operator_delete(local_190.m_name._M_dataplus._M_p,
                    local_190.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != paVar2) {
    operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
  }
  local_168._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"a_1","");
  local_190.m_negate = true;
  local_190.m_name.field_2._M_allocated_capacity = 0x737961776c615f5f;
  local_190.m_name.field_2._8_2_ = 0x5f5f;
  local_190.m_name._M_string_length = 10;
  local_190.m_name.field_2._M_local_buf[10] = '\0';
  local_190.m_name._M_dataplus._M_p = (pointer)paVar6;
  AttributeLocationTestUtil::Attribute::Attribute(&local_148,&vec4,&local_168,-1,&local_190,-1);
  std::
  vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
  ::emplace_back<deqp::gls::AttributeLocationTestUtil::Attribute>(&attributes,&local_148);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148.m_cond.m_name._M_dataplus._M_p != paVar3) {
    operator_delete(local_148.m_cond.m_name._M_dataplus._M_p,
                    local_148.m_cond.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148.m_name._M_dataplus._M_p != paVar4) {
    operator_delete(local_148.m_name._M_dataplus._M_p,
                    local_148.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148.m_type.m_name._M_dataplus._M_p != paVar1) {
    operator_delete(local_148.m_type.m_name._M_dataplus._M_p,
                    local_148.m_type.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190.m_name._M_dataplus._M_p != paVar6) {
    operator_delete(local_190.m_name._M_dataplus._M_p,
                    local_190.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != paVar2) {
    operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
  }
  pvVar5 = (void *)((long)&local_190 + 0x10);
  local_190._0_8_ = pvVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"a_0","");
  local_148.m_type.m_name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_148,local_190._0_8_,
             local_190.m_name._M_dataplus._M_p + local_190._0_8_);
  local_148.m_type.m_locationSize = 3;
  std::
  vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ::emplace_back<deqp::gls::AttributeLocationTestUtil::Bind>(&preLinkBindings,(Bind *)&local_148);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148.m_type.m_name._M_dataplus._M_p != paVar1) {
    operator_delete(local_148.m_type.m_name._M_dataplus._M_p,
                    local_148.m_type.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((void *)local_190._0_8_ != pvVar5) {
    operator_delete((void *)local_190._0_8_,local_190.m_name._M_string_length + 1);
  }
  local_190._0_8_ = pvVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"a_0","");
  local_148.m_type.m_name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_148,local_190._0_8_,
             local_190.m_name._M_dataplus._M_p + local_190._0_8_);
  local_148.m_type.m_locationSize = 5;
  std::
  vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ::emplace_back<deqp::gls::AttributeLocationTestUtil::Bind>(&preLinkBindings,(Bind *)&local_148);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148.m_type.m_name._M_dataplus._M_p != paVar1) {
    operator_delete(local_148.m_type.m_name._M_dataplus._M_p,
                    local_148.m_type.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((void *)local_190._0_8_ != pvVar5) {
    operator_delete((void *)local_190._0_8_,local_190.m_name._M_string_length + 1);
  }
  local_190._0_8_ = pvVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"a_0","");
  local_148.m_type.m_name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_148,local_190._0_8_,
             local_190.m_name._M_dataplus._M_p + local_190._0_8_);
  local_148.m_type.m_locationSize = 6;
  std::
  vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ::emplace_back<deqp::gls::AttributeLocationTestUtil::Bind>(&postLinkBindings,(Bind *)&local_148);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148.m_type.m_name._M_dataplus._M_p != paVar1) {
    operator_delete(local_148.m_type.m_name._M_dataplus._M_p,
                    local_148.m_type.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((void *)local_190._0_8_ != pvVar5) {
    operator_delete((void *)local_190._0_8_,local_190.m_name._M_string_length + 1);
  }
  local_148.m_type.m_name._M_dataplus._M_p = (pointer)0x0;
  local_148.m_type.m_name._M_string_length = 0;
  local_148.m_type.m_name.field_2._M_allocated_capacity = 0;
  AttributeLocationTestUtil::runTest
            ((this->super_TestCase).super_TestNode.m_testCtx,this->m_renderCtx,&attributes,
             &noBindings,&preLinkBindings,&postLinkBindings,true,false,
             (vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
              *)&local_148);
  std::
  vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
  ::~vector((vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
             *)&local_148);
  std::
  vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ::~vector(&postLinkBindings);
  std::
  vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ::~vector(&preLinkBindings);
  std::
  vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
  ::~vector(&attributes);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)vec4.m_name._M_dataplus._M_p != &vec4.m_name.field_2) {
    operator_delete(vec4.m_name._M_dataplus._M_p,vec4.m_name.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ::~vector(&noBindings);
  return STOP;
}

Assistant:

tcu::TestCase::IterateResult BindRelinkAttributeTest::iterate (void)
{
	const vector<Bind>	noBindings;
	const AttribType	vec4("vec4", 1, GL_FLOAT_VEC4);

	vector<Attribute>	attributes;
	vector<Bind>		preLinkBindings;
	vector<Bind>		postLinkBindings;

	attributes.push_back(Attribute(vec4, "a_0"));
	attributes.push_back(Attribute(vec4, "a_1"));

	preLinkBindings.push_back(Bind("a_0", 3));
	preLinkBindings.push_back(Bind("a_0", 5));

	postLinkBindings.push_back(Bind("a_0", 6));

	runTest(m_testCtx, m_renderCtx, attributes, noBindings, preLinkBindings, postLinkBindings, true);
	return STOP;
}